

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrRasterizer.cpp
# Opt level: O1

void __thiscall
rr::TriangleRasterizer::rasterize
          (TriangleRasterizer *this,FragmentPacket *fragmentPackets,float *depthValues,
          int maxFragmentPackets,int *numPacketsRasterized)

{
  float fVar1;
  uint uVar2;
  uint uVar3;
  long lVar4;
  bool bVar5;
  TriangleRasterizer *pTVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  byte bVar10;
  int iVar11;
  ulong uVar12;
  long lVar13;
  ulong uVar14;
  long lVar15;
  long *plVar16;
  ulong uVar17;
  long lVar18;
  long *plVar19;
  ulong uVar20;
  long lVar21;
  long lVar22;
  ulong uVar23;
  long *plVar24;
  long lVar25;
  long lVar26;
  long lVar27;
  long lVar28;
  float afStack_7b8 [4];
  undefined8 uStack_7a8;
  undefined8 uStack_7a0;
  int iStack_798;
  int iStack_794;
  ulong uStack_790;
  long *plStack_788;
  long *plStack_780;
  float afStack_778 [10];
  float fStack_750;
  float fStack_74c;
  float fStack_748;
  int iStack_744;
  int iStack_740;
  int iStack_73c;
  float afStack_738 [14];
  TriangleRasterizer *pTStack_700;
  ulong uStack_6f8;
  ulong uStack_6f0;
  float afStack_6e8 [4];
  int *piStack_6d8;
  FragmentPacket *pFStack_6d0;
  float *pfStack_6c8;
  long lStack_6c0;
  long lStack_6b8;
  long lStack_6b0;
  long lStack_6a8;
  long lStack_6a0;
  long lStack_698;
  long lStack_690;
  float afStack_688 [4];
  long alStack_678 [4];
  long alStack_658 [65];
  long alStack_450 [64];
  long alStack_250 [68];
  
  switch(this->m_numSamples) {
  case 1:
    rasterizeSingleSample(this,fragmentPackets,depthValues,maxFragmentPackets,numPacketsRasterized);
    return;
  case 2:
    rasterizeMultiSample<2>
              (this,fragmentPackets,depthValues,maxFragmentPackets,numPacketsRasterized);
    return;
  case 3:
  case 5:
  case 6:
  case 7:
    goto switchD_0053908f_caseD_3;
  case 4:
    rasterizeMultiSample<4>
              (this,fragmentPackets,depthValues,maxFragmentPackets,numPacketsRasterized);
    return;
  case 8:
    rasterizeMultiSample<8>
              (this,fragmentPackets,depthValues,maxFragmentPackets,numPacketsRasterized);
    return;
  default:
    if (this->m_numSamples == 0x10) {
      uVar2 = (this->m_curPos).m_data[1];
      uStack_6f0 = 0;
      piStack_6d8 = numPacketsRasterized;
      if (0 < maxFragmentPackets && (int)uVar2 <= (this->m_bboxMax).m_data[1]) {
        fStack_748 = (this->m_v2).m_data[2];
        fStack_74c = (this->m_v0).m_data[2] - fStack_748;
        fStack_750 = (this->m_v1).m_data[2] - fStack_748;
        uStack_6f0 = 0;
        iStack_744 = maxFragmentPackets;
        pTStack_700 = this;
        pFStack_6d0 = fragmentPackets;
        pfStack_6c8 = depthValues;
        do {
          pTVar6 = pTStack_700;
          uStack_790 = (ulong)uVar2;
          uVar3 = (pTStack_700->m_curPos).m_data[0];
          uStack_6f8 = (ulong)uVar3;
          alStack_658[0] = (long)(int)(uVar3 << 8);
          iStack_73c = uVar3 + 1;
          alStack_658[1] = (long)(iStack_73c * 0x100);
          alStack_678[0] = (long)(int)(uVar2 << 8);
          iStack_740 = uVar2 + 1;
          alStack_678[2] = (long)(iStack_740 * 0x100);
          iStack_798 = (pTStack_700->m_viewport).m_data[3] + (pTStack_700->m_viewport).m_data[1];
          iStack_794 = (pTStack_700->m_viewport).m_data[2] + (pTStack_700->m_viewport).m_data[0];
          alStack_678[1] = alStack_678[0];
          alStack_678[3] = alStack_678[2];
          alStack_658[2] = alStack_658[0];
          alStack_658[3] = alStack_658[1];
          memset(alStack_250 + 3,0,0x200);
          memset(alStack_450 + 3,0,0x200);
          plVar16 = alStack_658 + 4;
          memset(plVar16,0,0x200);
          lVar15 = (pTVar6->m_edge01).a;
          lVar18 = (pTVar6->m_edge01).b;
          lStack_6a8 = (pTVar6->m_edge01).c;
          lStack_6b0 = (pTVar6->m_edge12).a;
          lStack_6b8 = (pTVar6->m_edge12).b;
          lVar21 = (pTVar6->m_edge12).c;
          lVar22 = (pTVar6->m_edge20).a;
          lStack_6c0 = (pTVar6->m_edge20).b;
          lVar4 = (pTVar6->m_edge20).c;
          plVar19 = alStack_450 + 3;
          plVar24 = alStack_250 + 3;
          lVar27 = 0;
          do {
            lStack_6a0 = lVar27;
            plStack_780 = plVar24;
            plStack_788 = plVar19;
            lStack_690 = (&s_samplePos16)[lStack_6a0 * 2];
            lStack_698 = (&DAT_00b18ec8)[lStack_6a0 * 2];
            lVar27 = 0;
            do {
              lVar7 = alStack_658[lVar27] + lStack_690;
              lVar13 = alStack_678[lVar27] + lStack_698;
              plStack_780[lVar27] = lVar18 * lVar13 + lVar15 * lVar7 + lStack_6a8;
              plStack_788[lVar27] = lStack_6b8 * lVar13 + lStack_6b0 * lVar7 + lVar21;
              plVar16[lVar27] = lVar13 * lStack_6c0 + lVar7 * lVar22 + lVar4;
              lVar27 = lVar27 + 1;
            } while (lVar27 != 4);
            plVar16 = plVar16 + 4;
            plVar19 = plStack_788 + 4;
            plVar24 = plStack_780 + 4;
            lVar27 = lStack_6a0 + 1;
          } while (lStack_6a0 + 1 != 0x10);
          uVar14 = (ulong)(pTStack_700->m_edge01).inclusive;
          lVar15 = -uVar14;
          uVar17 = (ulong)(pTStack_700->m_edge12).inclusive;
          lVar18 = -uVar17;
          uVar20 = (ulong)(pTStack_700->m_edge20).inclusive;
          lVar21 = -uVar20;
          lVar22 = 0x18;
          uVar12 = 0;
          uVar8 = 0;
          do {
            lVar4 = *(long *)((long)alStack_250 + lVar22);
            if ((lVar4 == lVar15 || SBORROW8(lVar4,lVar15) != (long)(lVar4 + uVar14) < 0) ||
               (lVar4 = *(long *)((long)alStack_450 + lVar22),
               lVar4 == lVar18 || SBORROW8(lVar4,lVar18) != (long)(lVar4 + uVar17) < 0)) {
              bVar5 = false;
            }
            else {
              lVar4 = *(long *)((long)alStack_658 + lVar22 + 8);
              bVar5 = lVar4 != lVar21 && SBORROW8(lVar4,lVar21) == (long)(lVar4 + uVar20) < 0;
            }
            uVar9 = uVar8 & ~(1L << (uVar12 & 0x3f));
            if (bVar5) {
              uVar9 = uVar8 | 1L << (uVar12 & 0x3f);
            }
            if (((iStack_73c == iStack_794) ||
                (lVar4 = *(long *)((long)alStack_250 + lVar22 + 8),
                lVar4 == lVar15 || SBORROW8(lVar4,lVar15) != (long)(lVar4 + uVar14) < 0)) ||
               (lVar4 = *(long *)((long)alStack_450 + lVar22 + 8),
               lVar4 == lVar18 || SBORROW8(lVar4,lVar18) != (long)(lVar4 + uVar17) < 0)) {
              bVar5 = false;
            }
            else {
              lVar4 = *(long *)((long)alStack_658 + lVar22 + 0x10);
              bVar5 = lVar4 != lVar21 && SBORROW8(lVar4,lVar21) == (long)(lVar4 + uVar20) < 0;
            }
            bVar10 = (byte)uVar12;
            uVar23 = 0x100000000 << (bVar10 & 0x3f);
            uVar8 = ~uVar23 & uVar9;
            if (bVar5) {
              uVar8 = uVar9 | uVar23;
            }
            if (((iStack_740 == iStack_798) ||
                (lVar4 = *(long *)((long)alStack_250 + lVar22 + 0x10),
                lVar4 == lVar15 || SBORROW8(lVar4,lVar15) != (long)(lVar4 + uVar14) < 0)) ||
               (lVar4 = *(long *)((long)alStack_450 + lVar22 + 0x10),
               lVar4 == lVar18 || SBORROW8(lVar4,lVar18) != (long)(lVar4 + uVar17) < 0)) {
              bVar5 = false;
            }
            else {
              lVar4 = *(long *)((long)alStack_658 + lVar22 + 0x18);
              bVar5 = lVar4 != lVar21 && SBORROW8(lVar4,lVar21) == (long)(lVar4 + uVar20) < 0;
            }
            uVar23 = 0x10000L << (bVar10 & 0x3f);
            uVar9 = ~uVar23 & uVar8;
            if (bVar5) {
              uVar9 = uVar8 | uVar23;
            }
            if (((iStack_740 == iStack_798 || iStack_73c == iStack_794) ||
                (lVar4 = *(long *)((long)alStack_250 + lVar22 + 0x18),
                lVar4 == lVar15 || SBORROW8(lVar4,lVar15) != (long)(lVar4 + uVar14) < 0)) ||
               (lVar4 = *(long *)((long)alStack_450 + lVar22 + 0x18),
               lVar4 == lVar18 || SBORROW8(lVar4,lVar18) != (long)(lVar4 + uVar17) < 0)) {
              bVar5 = false;
            }
            else {
              lVar4 = *(long *)((long)alStack_658 + lVar22 + 0x20);
              bVar5 = lVar4 != lVar21 && SBORROW8(lVar4,lVar21) == (long)(lVar4 + uVar20) < 0;
            }
            uVar23 = 0x1000000000000 << (bVar10 & 0x3f);
            uVar8 = ~uVar23 & uVar9;
            if (bVar5) {
              uVar8 = uVar9 | uVar23;
            }
            uVar12 = uVar12 + 1;
            lVar22 = lVar22 + 0x20;
          } while (uVar12 != 0x10);
          iVar11 = (int)uStack_6f8 + 2;
          (pTStack_700->m_curPos).m_data[0] = iVar11;
          if ((pTStack_700->m_bboxMax).m_data[0] < iVar11) {
            (pTStack_700->m_curPos).m_data[1] = (int)uStack_790 + 2;
            (pTStack_700->m_curPos).m_data[0] = (pTStack_700->m_bboxMin).m_data[0];
          }
          if (uVar8 != 0) {
            iVar11 = (int)uStack_6f0;
            if (pfStack_6c8 != (float *)0x0) {
              plVar24 = alStack_658;
              plVar16 = alStack_450 + 3;
              plVar19 = alStack_250 + 3;
              lVar15 = 0;
              do {
                plVar24 = plVar24 + 4;
                afStack_738[8] = 0.0;
                afStack_738[9] = 0.0;
                afStack_738[10] = 0.0;
                afStack_738[0xb] = 0.0;
                lVar18 = 0;
                do {
                  afStack_738[lVar18 + 8] = (float)plVar19[lVar18];
                  lVar18 = lVar18 + 1;
                } while (lVar18 != 4);
                afStack_738[4] = 0.0;
                afStack_738[5] = 0.0;
                afStack_738[6] = 0.0;
                afStack_738[7] = 0.0;
                lVar18 = 0;
                do {
                  afStack_738[lVar18 + 4] = (float)plVar16[lVar18];
                  lVar18 = lVar18 + 1;
                } while (lVar18 != 4);
                afStack_738[0] = 0.0;
                afStack_738[1] = 0.0;
                afStack_738[2] = 0.0;
                afStack_738[3] = 0.0;
                lVar18 = 0;
                do {
                  afStack_738[lVar18] = (float)plVar24[lVar18];
                  lVar18 = lVar18 + 1;
                } while (lVar18 != 4);
                afStack_7b8[0] = 0.0;
                afStack_7b8[1] = 0.0;
                afStack_7b8[2] = 0.0;
                afStack_7b8[3] = 0.0;
                lVar18 = 0;
                do {
                  afStack_7b8[lVar18] = afStack_738[lVar18 + 8] + afStack_738[lVar18 + 4];
                  lVar18 = lVar18 + 1;
                } while (lVar18 != 4);
                afStack_778[4] = 0.0;
                afStack_778[5] = 0.0;
                afStack_778[6] = 0.0;
                afStack_778[7] = 0.0;
                lVar18 = 0;
                do {
                  afStack_778[lVar18 + 4] = afStack_7b8[lVar18] + afStack_738[lVar18];
                  lVar18 = lVar18 + 1;
                } while (lVar18 != 4);
                afStack_7b8[0] = 0.0;
                afStack_7b8[1] = 0.0;
                afStack_7b8[2] = 0.0;
                afStack_7b8[3] = 0.0;
                lVar18 = 0;
                do {
                  afStack_7b8[lVar18] = afStack_738[lVar18 + 4] / afStack_778[lVar18 + 4];
                  lVar18 = lVar18 + 1;
                } while (lVar18 != 4);
                afStack_778[0] = 0.0;
                afStack_778[1] = 0.0;
                afStack_778[2] = 0.0;
                afStack_778[3] = 0.0;
                lVar18 = 0;
                do {
                  afStack_778[lVar18] = afStack_738[lVar18] / afStack_778[lVar18 + 4];
                  lVar18 = lVar18 + 1;
                } while (lVar18 != 4);
                lVar18 = lVar15 + (iVar11 << 6);
                pfStack_6c8[lVar18] =
                     afStack_7b8[0] * fStack_74c + afStack_778[0] * fStack_750 + fStack_748;
                pfStack_6c8[lVar18 + 0x10] =
                     afStack_7b8[1] * fStack_74c + afStack_778[1] * fStack_750 + fStack_748;
                pfStack_6c8[lVar18 + 0x20] =
                     afStack_7b8[2] * fStack_74c + afStack_778[2] * fStack_750 + fStack_748;
                pfStack_6c8[lVar18 + 0x30] =
                     afStack_7b8[3] * fStack_74c + afStack_778[3] * fStack_750 + fStack_748;
                lVar15 = lVar15 + 1;
                plVar19 = plVar19 + 4;
                plVar16 = plVar16 + 4;
              } while (lVar15 != 0x10);
            }
            plStack_788 = (long *)(long)iVar11;
            afStack_738[8] = 0.0;
            afStack_738[9] = 0.0;
            afStack_738[10] = 0.0;
            afStack_738[0xb] = 0.0;
            afStack_738[4] = 0.0;
            afStack_738[5] = 0.0;
            afStack_738[6] = 0.0;
            afStack_738[7] = 0.0;
            afStack_738[0] = 0.0;
            afStack_738[1] = 0.0;
            afStack_738[2] = 0.0;
            afStack_738[3] = 0.0;
            plStack_780 = (long *)(pTStack_700->m_edge01).a;
            lVar15 = (pTStack_700->m_edge01).b;
            lVar18 = (pTStack_700->m_edge01).c;
            lVar21 = (pTStack_700->m_edge12).a;
            lVar22 = (pTStack_700->m_edge12).b;
            lVar4 = (pTStack_700->m_edge12).c;
            lVar27 = (pTStack_700->m_edge20).a;
            lVar7 = (pTStack_700->m_edge20).b;
            lVar13 = (pTStack_700->m_edge20).c;
            lVar28 = 0;
            do {
              lVar25 = *(long *)((long)alStack_658 + lVar28 * 2) + 0x80;
              lVar26 = *(long *)((long)alStack_678 + lVar28 * 2) + 0x80;
              *(float *)((long)afStack_738 + lVar28 + 0x20) =
                   (float)(lVar15 * lVar26 + (long)plStack_780 * lVar25 + lVar18);
              *(float *)((long)afStack_738 + lVar28 + 0x10) =
                   (float)(lVar22 * lVar26 + lVar21 * lVar25 + lVar4);
              *(float *)((long)afStack_738 + lVar28) =
                   (float)(lVar26 * lVar7 + lVar25 * lVar27 + lVar13);
              lVar28 = lVar28 + 4;
            } while (lVar28 != 0x10);
            fVar1 = (pTStack_700->m_v0).m_data[3];
            afStack_778[4] = 0.0;
            afStack_778[5] = 0.0;
            afStack_778[6] = 0.0;
            afStack_778[7] = 0.0;
            lVar15 = 0;
            do {
              afStack_778[lVar15 + 4] = afStack_738[lVar15 + 4] * fVar1;
              lVar15 = lVar15 + 1;
            } while (lVar15 != 4);
            fVar1 = (pTStack_700->m_v1).m_data[3];
            afStack_7b8[0] = 0.0;
            afStack_7b8[1] = 0.0;
            afStack_7b8[2] = 0.0;
            afStack_7b8[3] = 0.0;
            lVar15 = 0;
            do {
              afStack_7b8[lVar15] = afStack_738[lVar15] * fVar1;
              lVar15 = lVar15 + 1;
            } while (lVar15 != 4);
            fVar1 = (pTStack_700->m_v2).m_data[3];
            afStack_778[0] = 0.0;
            afStack_778[1] = 0.0;
            afStack_778[2] = 0.0;
            afStack_778[3] = 0.0;
            lVar15 = 0;
            do {
              afStack_778[lVar15] = afStack_738[lVar15 + 8] * fVar1;
              lVar15 = lVar15 + 1;
            } while (lVar15 != 4);
            uStack_7a8 = 0;
            uStack_7a0 = 0;
            lVar15 = 0;
            do {
              *(float *)((long)&uStack_7a8 + lVar15 * 4) =
                   afStack_778[lVar15 + 4] + afStack_7b8[lVar15];
              lVar15 = lVar15 + 1;
            } while (lVar15 != 4);
            afStack_6e8[0] = 0.0;
            afStack_6e8[1] = 0.0;
            afStack_6e8[2] = 0.0;
            afStack_6e8[3] = 0.0;
            lVar15 = 0;
            do {
              afStack_6e8[lVar15] = *(float *)((long)&uStack_7a8 + lVar15 * 4) + afStack_778[lVar15]
              ;
              lVar15 = lVar15 + 1;
            } while (lVar15 != 4);
            *(ulong *)pFStack_6d0[(long)plStack_788].position.m_data =
                 (uStack_790 << 0x20) + uStack_6f8;
            pFStack_6d0[(long)plStack_788].coverage = uVar8;
            uStack_7a8 = 0;
            uStack_7a0 = 0;
            lVar15 = 0;
            do {
              *(float *)((long)&uStack_7a8 + lVar15 * 4) =
                   afStack_778[lVar15 + 4] / afStack_6e8[lVar15];
              lVar15 = lVar15 + 1;
            } while (lVar15 != 4);
            *(undefined8 *)pFStack_6d0[(long)plStack_788].barycentric[0].m_data = uStack_7a8;
            *(undefined8 *)(pFStack_6d0[(long)plStack_788].barycentric[0].m_data + 2) = uStack_7a0;
            uStack_7a8 = 0;
            uStack_7a0 = 0;
            lVar15 = 0;
            do {
              *(float *)((long)&uStack_7a8 + lVar15 * 4) = afStack_7b8[lVar15] / afStack_6e8[lVar15]
              ;
              lVar15 = lVar15 + 1;
            } while (lVar15 != 4);
            *(undefined8 *)pFStack_6d0[(long)plStack_788].barycentric[1].m_data = uStack_7a8;
            *(undefined8 *)(pFStack_6d0[(long)plStack_788].barycentric[1].m_data + 2) = uStack_7a0;
            afStack_688[0] = 0.0;
            afStack_688[1] = 0.0;
            afStack_688[2] = 0.0;
            afStack_688[3] = 0.0;
            lVar15 = 0;
            do {
              afStack_688[lVar15] =
                   1.0 - pFStack_6d0[(long)plStack_788].barycentric[0].m_data[lVar15];
              lVar15 = lVar15 + 1;
            } while (lVar15 != 4);
            uStack_7a8 = 0;
            uStack_7a0 = 0;
            lVar15 = 0;
            do {
              *(float *)((long)&uStack_7a8 + lVar15 * 4) =
                   afStack_688[lVar15] -
                   pFStack_6d0[(long)plStack_788].barycentric[1].m_data[lVar15];
              lVar15 = lVar15 + 1;
            } while (lVar15 != 4);
            *(undefined8 *)pFStack_6d0[(long)plStack_788].barycentric[2].m_data = uStack_7a8;
            *(undefined8 *)(pFStack_6d0[(long)plStack_788].barycentric[2].m_data + 2) = uStack_7a0;
            uStack_6f0 = (ulong)(iVar11 + 1);
          }
          uVar2 = (pTStack_700->m_curPos).m_data[1];
        } while (((int)uVar2 <= (pTStack_700->m_bboxMax).m_data[1]) &&
                ((int)uStack_6f0 < iStack_744));
      }
      *piStack_6d8 = (int)uStack_6f0;
      return;
    }
switchD_0053908f_caseD_3:
    return;
  }
}

Assistant:

void TriangleRasterizer::rasterize (FragmentPacket* const fragmentPackets, float* const depthValues, const int maxFragmentPackets, int& numPacketsRasterized)
{
	DE_ASSERT(maxFragmentPackets > 0);

	switch (m_numSamples)
	{
		case 1:		rasterizeSingleSample		(fragmentPackets, depthValues, maxFragmentPackets, numPacketsRasterized);	break;
		case 2:		rasterizeMultiSample<2>		(fragmentPackets, depthValues, maxFragmentPackets, numPacketsRasterized);	break;
		case 4:		rasterizeMultiSample<4>		(fragmentPackets, depthValues, maxFragmentPackets, numPacketsRasterized);	break;
		case 8:		rasterizeMultiSample<8>		(fragmentPackets, depthValues, maxFragmentPackets, numPacketsRasterized);	break;
		case 16:	rasterizeMultiSample<16>	(fragmentPackets, depthValues, maxFragmentPackets, numPacketsRasterized);	break;
		default:
			DE_ASSERT(DE_FALSE);
	}
}